

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::runSingleRead
          (InterCallTestCase *this,int targetHandle,int stepNdx,int *programFriendlyName,
          int *resultStorageFriendlyName)

{
  ostringstream *this_00;
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  undefined4 uVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  local_1b8 = targetHandle;
  local_1b4 = stepNdx;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Running program #",0x11);
  iVar2 = *programFriendlyName;
  *programFriendlyName = iVar2 + 1;
  std::ostream::operator<<(this_00,iVar2 + 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," to verify ",0xb);
  bVar9 = this->m_storage == STORAGE_BUFFER;
  pcVar7 = "image";
  if (bVar9) {
    pcVar7 = "buffer";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,(ulong)bVar9 + 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," #",2);
  std::ostream::operator<<(this_00,targetHandle);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\tWriting results to result storage #",0x24);
  iVar2 = *resultStorageFriendlyName;
  *resultStorageFriendlyName = iVar2 + 1;
  std::ostream::operator<<(this_00,iVar2 + 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tDispatch size: ",0x10);
  std::ostream::operator<<(this_00,this->m_invocationGridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,this->m_invocationGridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  lVar8 = (long)local_1b4;
  (**(code **)(lVar4 + 0x1680))
            (((this->m_operationPrograms).
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8]->m_program).m_program);
  if (this->m_storage == STORAGE_IMAGE) {
    pcVar1 = *(code **)(lVar4 + 0x80);
    pmVar5 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&local_1b8);
    uVar6 = 0x822e;
    if (this->m_formatInteger != false) {
      uVar6 = 0x8235;
    }
    (*pcVar1)(1,*pmVar5,0,0,0,(uint)this->m_useAtomic * 2 + 35000,uVar6);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar7 = "bind source image";
    iVar2 = 0x65a;
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) goto LAB_014cf0e7;
    pcVar1 = *(code **)(lVar4 + 0x48);
    pmVar5 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&local_1b8);
    (*pcVar1)(0x90d2,1,*pmVar5);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar7 = "bind source buffer";
    iVar2 = 0x653;
  }
  glu::checkError(dVar3,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,iVar2);
LAB_014cf0e7:
  (**(code **)(lVar4 + 0x48))
            (0x90d2,0,(this->m_operationResultStorages).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bind result buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x662);
  (**(code **)(lVar4 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"dispatch read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x666);
  return;
}

Assistant:

void InterCallTestCase::runSingleRead (int targetHandle, int stepNdx, int& programFriendlyName, int& resultStorageFriendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Running program #" << ++programFriendlyName << " to verify " << ((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) << " #" << targetHandle << ".\n"
		<< "	Writing results to result storage #" << ++resultStorageFriendlyName << ".\n"
		<< "	Dispatch size: " << m_invocationGridSize << "x" << m_invocationGridSize << "."
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_operationPrograms[stepNdx]->getProgram());

	// set source
	if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageIDs[targetHandle]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buffer");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindImageTexture(1, m_storageIDs[targetHandle], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_READ_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source image");
	}
	else
		DE_ASSERT(DE_FALSE);

	// set destination
	DE_ASSERT(m_operationResultStorages[stepNdx]);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_operationResultStorages[stepNdx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buffer");

	// calc
	gl.dispatchCompute(m_invocationGridSize, m_invocationGridSize, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch read");
}